

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void FM::OPNB::InitADPCMATable(void)

{
  double dVar1;
  double in_XMM1_Qa;
  int local_14;
  int j;
  int s;
  int i;
  
  for (j = 0; j < 0x31; j = j + 1) {
    dVar1 = std::pow(1.1,in_XMM1_Qa);
    in_XMM1_Qa = 3.0;
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      *(int *)(jedi_table + (long)(j * 0x10 + local_14) * 4) =
           ((int)(dVar1 * 16.0 * 3.0) * (int)InitADPCMATable::table2[local_14]) / 8;
    }
  }
  return;
}

Assistant:

void OPNB::InitADPCMATable()
{
	const static int8 table2[] =
	{
		 1,  3,  5,  7,  9, 11, 13, 15,
		-1, -3, -5, -7, -9,-11,-13,-15,
	};

	for (int i=0; i<=48; i++)
	{
		int s = int(16.0 * pow (1.1, i) * 3);
		for (int j=0; j<16; j++)
		{
			jedi_table[i*16+j] = s * table2[j] / 8;
		}
	}
}